

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O1

bool __thiscall draco::ObjEncoder::EncodeMaterial(ObjEncoder *this,FaceIndex face_id)

{
  PointAttribute *this_00;
  EncoderBuffer *pEVar1;
  ulong uVar2;
  bool bVar3;
  uint in_EAX;
  _Hash_node_base *p_Var4;
  ulong uVar5;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> att_id;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  int material_id;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  this_00 = this->material_att_;
  att_id.value_ =
       (this->in_mesh_->faces_).vector_.
       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start[face_id.value_]._M_elems[0].value_;
  if (this_00->identity_mapping_ == false) {
    att_id.value_ =
         (this_00->indices_map_).vector_.
         super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[att_id.value_].value_;
  }
  bVar3 = GeometryAttribute::ConvertValue<int>
                    (&this_00->super_GeometryAttribute,(AttributeValueIndex)att_id.value_,
                     (this_00->super_GeometryAttribute).num_components_,
                     (int *)((long)&uStack_18 + 4));
  if (bVar3) {
    if (uStack_18._4_4_ == this->current_material_id_) {
      return true;
    }
    pEVar1 = this->out_buffer_;
    if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)pEVar1,
                 (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,"usemtl ","");
    }
    uVar2 = (this->material_id_to_name_)._M_h._M_bucket_count;
    uVar5 = (ulong)(long)uStack_18._4_4_ % uVar2;
    p_Var6 = (this->material_id_to_name_)._M_h._M_buckets[uVar5];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var6 != (__node_base_ptr)0x0) &&
       (p_Var4 = p_Var6->_M_nxt, p_Var7 = p_Var6,
       uStack_18._4_4_ != *(int *)&p_Var6->_M_nxt[1]._M_nxt)) {
      while (p_Var6 = p_Var4, p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var4[1]._M_nxt % uVar2 != uVar5) ||
           (p_Var7 = p_Var6, uStack_18._4_4_ == *(int *)&p_Var4[1]._M_nxt)) goto LAB_00111416;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_00111416:
    if (p_Var7 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var7->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      pEVar1 = this->out_buffer_;
      if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar1,
                   (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,p_Var4[2]._M_nxt,
                   (long)&(p_Var4[2]._M_nxt)->_M_nxt + (long)&(p_Var4[3]._M_nxt)->_M_nxt);
      }
      pEVar1 = this->out_buffer_;
      if (pEVar1->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)pEVar1,
                   (pEVar1->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,"\n","");
      }
      this->current_material_id_ = uStack_18._4_4_;
      return true;
    }
  }
  return false;
}

Assistant:

bool ObjEncoder::EncodeMaterial(FaceIndex face_id) {
  int material_id = 0;
  // Pick the first corner, all corners of a face should have same id.
  const PointIndex vert_index = in_mesh_->face(face_id)[0];
  const AttributeValueIndex index_id(material_att_->mapped_index(vert_index));
  if (!material_att_->ConvertValue<int>(index_id, &material_id)) {
    return false;
  }

  if (material_id != current_material_id_) {
    // Update material information.
    buffer()->Encode("usemtl ", 7);
    const auto mat_ptr = material_id_to_name_.find(material_id);
    // If the material id is not found.
    if (mat_ptr == material_id_to_name_.end()) {
      return false;
    }
    buffer()->Encode(mat_ptr->second.c_str(), mat_ptr->second.size());
    buffer()->Encode("\n", 1);
    current_material_id_ = material_id;
  }
  return true;
}